

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImDrawList::_OnChangedClipRect(ImDrawList *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [11];
  undefined1 auVar4 [12];
  undefined1 auVar5 [13];
  undefined1 auVar6 [14];
  float fVar7;
  int iVar8;
  ImDrawCmd *pIVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  byte bVar25;
  ImDrawCmd *prev_cmd;
  ImDrawCmd *curr_cmd;
  ImDrawList *this_local;
  
  pIVar9 = (this->CmdBuffer).Data + ((this->CmdBuffer).Size + -1);
  if (pIVar9->ElemCount != 0) {
    cVar10 = -(*(char *)&(pIVar9->ClipRect).x == *(char *)&(this->_CmdHeader).ClipRect.x);
    cVar11 = -(*(char *)((long)&(pIVar9->ClipRect).x + 1) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.x + 1));
    cVar12 = -(*(char *)((long)&(pIVar9->ClipRect).x + 2) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.x + 2));
    cVar13 = -(*(char *)((long)&(pIVar9->ClipRect).x + 3) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.x + 3));
    cVar14 = -(*(char *)&(pIVar9->ClipRect).y == *(char *)&(this->_CmdHeader).ClipRect.y);
    cVar15 = -(*(char *)((long)&(pIVar9->ClipRect).y + 1) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.y + 1));
    cVar16 = -(*(char *)((long)&(pIVar9->ClipRect).y + 2) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.y + 2));
    cVar17 = -(*(char *)((long)&(pIVar9->ClipRect).y + 3) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.y + 3));
    cVar18 = -(*(char *)&(pIVar9->ClipRect).z == *(char *)&(this->_CmdHeader).ClipRect.z);
    cVar19 = -(*(char *)((long)&(pIVar9->ClipRect).z + 1) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.z + 1));
    cVar20 = -(*(char *)((long)&(pIVar9->ClipRect).z + 2) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.z + 2));
    cVar21 = -(*(char *)((long)&(pIVar9->ClipRect).z + 3) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.z + 3));
    cVar22 = -(*(char *)&(pIVar9->ClipRect).w == *(char *)&(this->_CmdHeader).ClipRect.w);
    cVar23 = -(*(char *)((long)&(pIVar9->ClipRect).w + 1) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.w + 1));
    cVar24 = -(*(char *)((long)&(pIVar9->ClipRect).w + 2) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.w + 2));
    bVar25 = -(*(char *)((long)&(pIVar9->ClipRect).w + 3) ==
              *(char *)((long)&(this->_CmdHeader).ClipRect.w + 3));
    auVar1[1] = cVar11;
    auVar1[0] = cVar10;
    auVar1[2] = cVar12;
    auVar1[3] = cVar13;
    auVar1[4] = cVar14;
    auVar1[5] = cVar15;
    auVar1[6] = cVar16;
    auVar1[7] = cVar17;
    auVar1[8] = cVar18;
    auVar1[9] = cVar19;
    auVar1[10] = cVar20;
    auVar1[0xb] = cVar21;
    auVar1[0xc] = cVar22;
    auVar1[0xd] = cVar23;
    auVar1[0xe] = cVar24;
    auVar1[0xf] = bVar25;
    auVar2[1] = cVar11;
    auVar2[0] = cVar10;
    auVar2[2] = cVar12;
    auVar2[3] = cVar13;
    auVar2[4] = cVar14;
    auVar2[5] = cVar15;
    auVar2[6] = cVar16;
    auVar2[7] = cVar17;
    auVar2[8] = cVar18;
    auVar2[9] = cVar19;
    auVar2[10] = cVar20;
    auVar2[0xb] = cVar21;
    auVar2[0xc] = cVar22;
    auVar2[0xd] = cVar23;
    auVar2[0xe] = cVar24;
    auVar2[0xf] = bVar25;
    auVar6[1] = cVar13;
    auVar6[0] = cVar12;
    auVar6[2] = cVar14;
    auVar6[3] = cVar15;
    auVar6[4] = cVar16;
    auVar6[5] = cVar17;
    auVar6[6] = cVar18;
    auVar6[7] = cVar19;
    auVar6[8] = cVar20;
    auVar6[9] = cVar21;
    auVar6[10] = cVar22;
    auVar6[0xb] = cVar23;
    auVar6[0xc] = cVar24;
    auVar6[0xd] = bVar25;
    auVar5[1] = cVar14;
    auVar5[0] = cVar13;
    auVar5[2] = cVar15;
    auVar5[3] = cVar16;
    auVar5[4] = cVar17;
    auVar5[5] = cVar18;
    auVar5[6] = cVar19;
    auVar5[7] = cVar20;
    auVar5[8] = cVar21;
    auVar5[9] = cVar22;
    auVar5[10] = cVar23;
    auVar5[0xb] = cVar24;
    auVar5[0xc] = bVar25;
    auVar4[1] = cVar15;
    auVar4[0] = cVar14;
    auVar4[2] = cVar16;
    auVar4[3] = cVar17;
    auVar4[4] = cVar18;
    auVar4[5] = cVar19;
    auVar4[6] = cVar20;
    auVar4[7] = cVar21;
    auVar4[8] = cVar22;
    auVar4[9] = cVar23;
    auVar4[10] = cVar24;
    auVar4[0xb] = bVar25;
    auVar3[1] = cVar16;
    auVar3[0] = cVar15;
    auVar3[2] = cVar17;
    auVar3[3] = cVar18;
    auVar3[4] = cVar19;
    auVar3[5] = cVar20;
    auVar3[6] = cVar21;
    auVar3[7] = cVar22;
    auVar3[8] = cVar23;
    auVar3[9] = cVar24;
    auVar3[10] = bVar25;
    if ((ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar2 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB141(auVar6 >> 7,0) & 1) << 2 | (ushort)(SUB131(auVar5 >> 7,0) & 1) << 3
                 | (ushort)(SUB121(auVar4 >> 7,0) & 1) << 4 |
                 (ushort)(SUB111(auVar3 >> 7,0) & 1) << 5 |
                 (ushort)((byte)(CONCAT19(bVar25,CONCAT18(cVar24,CONCAT17(cVar23,CONCAT16(cVar22,
                                                  CONCAT15(cVar21,CONCAT14(cVar20,CONCAT13(cVar19,
                                                  CONCAT12(cVar18,CONCAT11(cVar17,cVar16))))))))) >>
                                7) & 1) << 6 |
                 (ushort)((byte)(CONCAT18(bVar25,CONCAT17(cVar24,CONCAT16(cVar23,CONCAT15(cVar22,
                                                  CONCAT14(cVar21,CONCAT13(cVar20,CONCAT12(cVar19,
                                                  CONCAT11(cVar18,cVar17)))))))) >> 7) & 1) << 7 |
                (ushort)(bVar25 >> 7) << 0xf) != 0xffff) {
      AddDrawCmd(this);
      return;
    }
  }
  if (pIVar9->UserCallback == (ImDrawCallback)0x0) {
    if ((((pIVar9->ElemCount == 0) && (1 < (this->CmdBuffer).Size)) &&
        (iVar8 = memcmp(&this->_CmdHeader,pIVar9 + -1,0x1c), iVar8 == 0)) &&
       (pIVar9[-1].UserCallback == (ImDrawCallback)0x0)) {
      ImVector<ImDrawCmd>::pop_back(&this->CmdBuffer);
      return;
    }
    fVar7 = (this->_CmdHeader).ClipRect.y;
    (pIVar9->ClipRect).x = (this->_CmdHeader).ClipRect.x;
    (pIVar9->ClipRect).y = fVar7;
    fVar7 = (this->_CmdHeader).ClipRect.w;
    (pIVar9->ClipRect).z = (this->_CmdHeader).ClipRect.z;
    (pIVar9->ClipRect).w = fVar7;
    return;
  }
  __assert_fail("curr_cmd->UserCallback == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui_draw.cpp"
                ,0x1ea,"void ImDrawList::_OnChangedClipRect()");
}

Assistant:

void ImDrawList::_OnChangedClipRect()
{
    // If current command is used with different settings we need to add a new command
    ImDrawCmd* curr_cmd = &CmdBuffer.Data[CmdBuffer.Size - 1];
    if (curr_cmd->ElemCount != 0 && memcmp(&curr_cmd->ClipRect, &_CmdHeader.ClipRect, sizeof(ImVec4)) != 0)
    {
        AddDrawCmd();
        return;
    }
    IM_ASSERT(curr_cmd->UserCallback == NULL);

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = curr_cmd - 1;
    if (curr_cmd->ElemCount == 0 && CmdBuffer.Size > 1 && ImDrawCmd_HeaderCompare(&_CmdHeader, prev_cmd) == 0 && prev_cmd->UserCallback == NULL)
    {
        CmdBuffer.pop_back();
        return;
    }

    curr_cmd->ClipRect = _CmdHeader.ClipRect;
}